

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_iremainder(LispPTR tosm1,LispPTR tos)

{
  ushort uVar1;
  LispPTR *pLVar2;
  float *pfVar3;
  uint *NAddr;
  LispPTR LVar4;
  uint uVar5;
  LispPTR LVar6;
  
  if ((tosm1 & 0xfff0000) != 0xf0000) {
    if ((tosm1 & 0xfff0000) == 0xe0000) {
      LVar6 = tosm1 & 0xffff;
      goto LAB_00107895;
    }
    uVar1 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar3 = (float *)NativeAligned4FromLAddr(tosm1);
      if (*pfVar3 == 2.1474836e+09) {
        LVar6 = (LispPTR)*pfVar3;
        goto LAB_00107895;
      }
    }
    else if (uVar1 == 2) {
      pLVar2 = NativeAligned4FromLAddr(tosm1);
      LVar6 = *pLVar2;
      goto LAB_00107895;
    }
    goto LAB_0010792c;
  }
  LVar6 = tosm1 | 0xffff0000;
LAB_00107895:
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar4 = tos | 0xffff0000;
LAB_0010790c:
    uVar5 = (uint)((long)(int)LVar6 % (long)(int)LVar4);
    if ((uVar5 & 0xffff0000) == 0xffff0000) {
      LVar6 = uVar5 & 0xffff | 0xf0000;
    }
    else {
      if (((long)(int)LVar6 % (long)(int)LVar4 & 0xffff0000U) != 0) {
        NAddr = (uint *)createcell68k(2);
        *NAddr = uVar5;
        LVar6 = LAddrFromNative(NAddr);
        return LVar6;
      }
      LVar6 = uVar5 | 0xe0000;
    }
  }
  else {
    if ((tos & 0xfff0000) == 0xe0000) {
      LVar4 = tos & 0xffff;
LAB_00107908:
      if (LVar4 != 0) goto LAB_0010790c;
    }
    else {
      uVar1 = *(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar1 == 3) {
        pfVar3 = (float *)NativeAligned4FromLAddr(tos);
        if (*pfVar3 == 2.1474836e+09) {
          LVar4 = (LispPTR)*pfVar3;
          goto LAB_00107908;
        }
      }
      else if (uVar1 == 2) {
        pLVar2 = NativeAligned4FromLAddr(tos);
        LVar4 = *pLVar2;
        goto LAB_00107908;
      }
    }
LAB_0010792c:
    MachineState.errorexit = 1;
    LVar6 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return LVar6;
}

Assistant:

LispPTR N_OP_iremainder(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn;

  result = arg1 % arg2;
  N_ARITH_SWITCH(result);

doufn:
  ERROR_EXIT(tos);

}